

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::TimingCheckEventSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,TimingCheckEventSyntax *this,size_t index)

{
  Token token;
  SyntaxNode *node;
  size_t index_local;
  TimingCheckEventSyntax *this_local;
  
  switch(index) {
  case 0:
    token.kind = (this->edge).kind;
    token._2_1_ = (this->edge).field_0x2;
    token.numFlags.raw = (this->edge).numFlags.raw;
    token.rawLen = (this->edge).rawLen;
    token.info = (this->edge).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 1:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              (__return_storage_ptr__,&this->controlSpecifier->super_SyntaxNode);
    break;
  case 2:
    node = (SyntaxNode *)not_null<slang::syntax::NameSyntax_*>::get(&this->terminal);
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,node);
    break;
  case 3:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              (__return_storage_ptr__,&this->condition->super_SyntaxNode);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax TimingCheckEventSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return edge;
        case 1: return controlSpecifier;
        case 2: return terminal.get();
        case 3: return condition;
        default: return nullptr;
    }
}